

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::eval_refract_vec4(ShaderEvalContext *c)

{
  float *pfVar1;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  undefined8 local_20;
  undefined8 local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_30,(int)c + 0x30,1,2,3);
  tcu::Vector<float,_4>::swizzle(&local_40,(int)local_10 + 0x40,3,2,1);
  pfVar1 = tcu::Vector<float,_4>::y(local_10->in + 2);
  tcu::refract<float,4>((tcu *)&local_20,&local_30,&local_40,*pfVar1);
  *(undefined8 *)(local_10->color).m_data = local_20;
  *(undefined8 *)((local_10->color).m_data + 2) = local_18;
  return;
}

Assistant:

void eval_refract_vec4	(ShaderEvalContext& c) { c.color		= refract(c.in[0].swizzle(1, 2, 3, 0), c.in[1].swizzle(3, 2, 1, 0), c.in[2].y()); }